

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O1

void bench_ellswift_decode(void *arg,int iters)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  char cVar4;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  bool bVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  char *pcVar27;
  ulong uVar28;
  undefined1 *puVar29;
  void *pvVar30;
  void *pvVar31;
  void *pvVar32;
  uint uVar33;
  undefined8 *puVar34;
  long lVar35;
  long lVar36;
  char **argv;
  int argc;
  undefined8 *puVar37;
  undefined8 *puVar38;
  ulong uVar40;
  char **ppcVar41;
  ulong uVar42;
  size_t __size;
  undefined8 *puVar43;
  char cVar44;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  undefined1 auVar45 [16];
  char cVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar69;
  short sVar70;
  undefined1 auVar77 [16];
  short sVar78;
  short sVar79;
  undefined1 auVar84 [12];
  undefined1 auVar89 [16];
  undefined4 uVar91;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  size_t len;
  secp256k1_pubkey out;
  int in_stack_fffffffffffffc70;
  undefined8 auStack_368 [2];
  void *pvStack_358;
  void *pvStack_350;
  void *pvStack_348;
  void *pvStack_340;
  long lStack_338;
  undefined1 uStack_330;
  undefined1 uStack_32f;
  undefined1 uStack_32e;
  undefined1 uStack_32d;
  undefined8 uStack_32c;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  undefined8 uStack_318;
  undefined8 uStack_308;
  char acStack_300 [32];
  undefined1 auStack_2e0 [32];
  undefined1 auStack_2c0 [72];
  undefined8 uStack_278;
  undefined1 auStack_270 [40];
  undefined8 uStack_248;
  undefined8 auStack_240 [13];
  undefined1 auStack_1d8 [64];
  undefined1 auStack_198 [64];
  undefined8 uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  undefined8 *puStack_140;
  undefined8 *puStack_138;
  code *pcStack_130;
  int iStack_124;
  undefined8 *puStack_120;
  undefined8 uStack_118;
  ulong uStack_110;
  undefined8 *puStack_108;
  undefined1 *puStack_100;
  undefined8 *puStack_f8;
  undefined8 *puStack_f0;
  code *pcStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  ulong uStack_a0;
  undefined1 *puStack_98;
  undefined1 *puStack_90;
  void *pvStack_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined1 local_70 [64];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined8 uVar39;
  long lVar54;
  undefined4 uVar71;
  undefined6 uVar72;
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [14];
  undefined1 auVar76 [14];
  undefined4 uVar80;
  undefined6 uVar81;
  undefined8 uVar82;
  undefined1 auVar83 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [14];
  undefined1 auVar87 [14];
  undefined1 auVar88 [14];
  undefined1 auVar90 [16];
  undefined6 uVar92;
  undefined8 uVar93;
  undefined1 auVar94 [12];
  undefined1 auVar95 [14];
  undefined1 auVar98 [16];
  
  if (iters < 1) {
    return;
  }
  lVar35 = (long)arg + 0x4008;
  uVar28 = 0;
  while( true ) {
    puVar37 = *arg;
    pcStack_80 = (code *)0x102e72;
    puVar29 = local_70;
    iVar24 = secp256k1_ellswift_decode(puVar37,local_70,lVar35);
    uVar33 = (uint)puVar29;
    if (iVar24 != 1) break;
    local_78 = 0x21;
    puVar37 = *arg;
    lVar36 = (ulong)((uint)uVar28 & 0x1f) + lVar35;
    pcStack_80 = (code *)0x102e9b;
    iVar24 = secp256k1_ec_pubkey_serialize(puVar37,lVar36,&local_78,local_70,0x102);
    uVar33 = (uint)lVar36;
    if (iVar24 == 0) goto LAB_00102eb9;
    uVar33 = (uint)uVar28 + 1;
    uVar28 = (ulong)uVar33;
    if (iters == uVar33) {
      return;
    }
  }
  pcStack_80 = (code *)0x102eb9;
  bench_ellswift_decode_cold_1();
LAB_00102eb9:
  pcStack_80 = bench_ellswift_create;
  bench_ellswift_decode_cold_2();
  if ((int)uVar33 < 1) {
    return;
  }
  puVar1 = puVar37 + 0x801;
  uStack_a0 = (ulong)(uint)iters;
  puStack_98 = local_70;
  puStack_90 = (undefined1 *)&local_78;
  pvStack_88 = arg;
  pcStack_80 = (code *)lVar35;
  while( true ) {
    puVar38 = (undefined8 *)*puVar37;
    pcStack_e8 = (code *)0x102ef6;
    iStack_124 = (int)&uStack_e0;
    iVar24 = secp256k1_ellswift_create(puVar38,&uStack_e0,puVar1,puVar37 + 0x805);
    if (iVar24 == 0) break;
    puVar37[0x807] = uStack_b0;
    puVar37[0x808] = uStack_a8;
    puVar37[0x805] = uStack_c0;
    puVar37[0x806] = uStack_b8;
    puVar37[0x803] = uStack_d0;
    puVar37[0x804] = uStack_c8;
    *puVar1 = uStack_e0;
    puVar37[0x802] = uStack_d8;
    uVar33 = uVar33 - 1;
    if (uVar33 == 0) {
      return;
    }
  }
  pcStack_e8 = bench_ellswift_xdh;
  bench_ellswift_create_cold_1();
  if (iStack_124 < 1) {
    return;
  }
  puVar2 = puVar38 + 0x801;
  uStack_118 = _secp256k1_ellswift_xdh_hash_function_bip324;
  puVar34 = puVar38 + 0x803;
  uVar40 = 0x10;
  uVar42 = 0;
  puVar43 = puVar2;
  puStack_120 = puVar38;
  uStack_110 = (ulong)uVar33;
  puStack_108 = puVar37 + 0x805;
  puStack_100 = (undefined1 *)&uStack_e0;
  puStack_f8 = puVar37;
  puStack_f0 = puVar1;
  pcStack_e8 = (code *)uVar28;
  while( true ) {
    argv = (char **)((long)puVar43 + (uVar42 / 0x21) * -0x21);
    uVar39 = *puStack_120;
    pcStack_130 = (code *)0x0;
    puStack_138 = (undefined8 *)uStack_118;
    puStack_140 = (undefined8 *)0x102fe0;
    iVar24 = secp256k1_ellswift_xdh
                       (uVar39,argv,puVar2,puVar2,(long)puVar34 + (uVar40 / 0x21) * -0x21);
    argc = (int)uVar39;
    if (iVar24 != 1) break;
    uVar42 = uVar42 + 1;
    puVar34 = (undefined8 *)((long)puVar34 + 1);
    uVar40 = uVar40 + 1;
    puVar43 = (undefined8 *)((long)puVar43 + 1);
    if (iStack_124 == (int)uVar42) {
      return;
    }
  }
  pcStack_130 = main;
  bench_ellswift_xdh_cold_1();
  uStack_158 = 0xf83e0f83e0f83e1;
  uStack_150 = uVar40;
  uStack_148 = uVar42;
  puStack_140 = puVar2;
  puStack_138 = puVar43;
  pcStack_130 = (code *)puVar34;
  pcVar27 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar27 == (char *)0x0) {
    uVar28 = 20000;
  }
  else {
    uVar28 = strtol(pcVar27,(char **)0x0,0);
  }
  bVar23 = true;
  if (argc != 1) {
    ppcVar41 = argv + 1;
    do {
      pcVar27 = *ppcVar41;
      lVar35 = 0;
      while (iVar24 = strcmp(pcVar27,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar35)),
            iVar24 != 0) {
        lVar35 = lVar35 + 8;
        if (lVar35 == 0xa8) {
          bVar23 = false;
          goto LAB_001030c7;
        }
      }
      ppcVar41 = ppcVar41 + 1;
    } while (ppcVar41 != argv + argc);
    bVar23 = true;
  }
LAB_001030c7:
  lVar35 = (long)argc * 8;
  if (1 < argc) {
    lVar36 = 8;
    do {
      lVar54 = lVar36;
      if (lVar35 - lVar54 == 0) goto LAB_0010310a;
      pcVar27 = *(char **)((long)argv + lVar54);
      iVar24 = strcmp(pcVar27,"-h");
      iVar25 = (int)pcVar27;
      lVar36 = lVar54 + 8;
    } while (iVar24 != 0);
    if (lVar35 - lVar54 != 0) {
LAB_00103164:
      help(iVar25);
      return;
    }
LAB_0010310a:
    lVar36 = 8;
    do {
      lVar54 = lVar36;
      if (lVar35 - lVar54 == 0) goto LAB_00103137;
      pcVar27 = *(char **)((long)argv + lVar54);
      iVar24 = strcmp(pcVar27,"--help");
      iVar25 = (int)pcVar27;
      lVar36 = lVar54 + 8;
    } while (iVar24 != 0);
    if (lVar35 - lVar54 != 0) goto LAB_00103164;
LAB_00103137:
    lVar36 = 8;
    do {
      lVar54 = lVar36;
      if (lVar35 - lVar54 == 0) goto LAB_0010316e;
      pcVar27 = *(char **)((long)argv + lVar54);
      iVar24 = strcmp(pcVar27,"help");
      iVar25 = (int)pcVar27;
      lVar36 = lVar54 + 8;
    } while (iVar24 != 0);
    if (lVar35 - lVar54 != 0) goto LAB_00103164;
LAB_0010316e:
    if (!bVar23) {
      main_cold_1();
      return;
    }
  }
  lVar36 = 8;
  do {
    lVar54 = lVar36;
    if (lVar35 - lVar54 == 0) goto LAB_001031aa;
    iVar24 = strcmp(*(char **)((long)argv + lVar54),"recover");
    lVar36 = lVar54 + 8;
  } while (iVar24 != 0);
  if (lVar35 - lVar54 != 0) {
LAB_00103a45:
    main_cold_2();
    return;
  }
LAB_001031aa:
  lVar36 = 8;
  do {
    lVar54 = lVar36;
    if (lVar35 - lVar54 == 0) goto LAB_001031db;
    iVar24 = strcmp(*(char **)((long)argv + lVar54),"ecdsa_recover");
    lVar36 = lVar54 + 8;
  } while (iVar24 != 0);
  if (lVar35 - lVar54 != 0) goto LAB_00103a45;
LAB_001031db:
  uStack_308 = secp256k1_context_create(1);
  lVar36 = 8;
  auVar45 = _DAT_00105010;
  auVar62 = _DAT_00105020;
  auVar63 = _DAT_00105030;
  auVar64 = _DAT_00105040;
  auVar65 = _DAT_00105050;
  auVar66 = _DAT_00105060;
  auVar67 = _DAT_00105070;
  auVar68 = _DAT_00105080;
  do {
    auVar77 = auVar68 & _DAT_00105090;
    auVar89 = auVar67 & _DAT_00105090;
    sVar11 = auVar77._0_2_;
    cVar52 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[0] - (0xff < sVar11);
    sVar11 = auVar77._2_2_;
    sVar69 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar77[2] - (0xff < sVar11),cVar52);
    sVar11 = auVar77._4_2_;
    cVar44 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[4] - (0xff < sVar11);
    sVar11 = auVar77._6_2_;
    uVar71 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar77[6] - (0xff < sVar11),
                      CONCAT12(cVar44,sVar69));
    sVar11 = auVar77._8_2_;
    cVar46 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[8] - (0xff < sVar11);
    sVar11 = auVar77._10_2_;
    uVar72 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar77[10] - (0xff < sVar11),
                      CONCAT14(cVar46,uVar71));
    sVar11 = auVar77._12_2_;
    cVar47 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[0xc] - (0xff < sVar11);
    sVar11 = auVar77._14_2_;
    uVar39 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar77[0xe] - (0xff < sVar11),
                      CONCAT16(cVar47,uVar72));
    sVar11 = auVar89._0_2_;
    cVar48 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[0] - (0xff < sVar11);
    sVar11 = auVar89._2_2_;
    auVar73._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar89[2] - (0xff < sVar11),
                  CONCAT18(cVar48,uVar39));
    sVar11 = auVar89._4_2_;
    cVar49 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[4] - (0xff < sVar11);
    auVar73[10] = cVar49;
    sVar11 = auVar89._6_2_;
    auVar73[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar89[6] - (0xff < sVar11);
    sVar11 = auVar89._8_2_;
    cVar50 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[8] - (0xff < sVar11);
    auVar75[0xc] = cVar50;
    auVar75._0_12_ = auVar73;
    sVar11 = auVar89._10_2_;
    auVar75[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar89[10] - (0xff < sVar11);
    sVar11 = auVar89._12_2_;
    cVar51 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[0xc] - (0xff < sVar11);
    auVar77[0xe] = cVar51;
    auVar77._0_14_ = auVar75;
    sVar11 = auVar89._14_2_;
    auVar77[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar89[0xe] - (0xff < sVar11);
    auVar89 = auVar66 & _DAT_00105090;
    auVar96 = auVar65 & _DAT_00105090;
    sVar11 = auVar89._0_2_;
    cVar61 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[0] - (0xff < sVar11);
    sVar11 = auVar89._2_2_;
    sVar78 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar89[2] - (0xff < sVar11),cVar61);
    sVar11 = auVar89._4_2_;
    cVar60 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[4] - (0xff < sVar11);
    sVar11 = auVar89._6_2_;
    uVar80 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar89[6] - (0xff < sVar11),
                      CONCAT12(cVar60,sVar78));
    sVar11 = auVar89._8_2_;
    cVar53 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[8] - (0xff < sVar11);
    sVar11 = auVar89._10_2_;
    uVar81 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar89[10] - (0xff < sVar11),
                      CONCAT14(cVar53,uVar80));
    sVar11 = auVar89._12_2_;
    cVar59 = (0 < sVar11) * (sVar11 < 0x100) * auVar89[0xc] - (0xff < sVar11);
    sVar11 = auVar89._14_2_;
    uVar82 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar89[0xe] - (0xff < sVar11),
                      CONCAT16(cVar59,uVar81));
    sVar11 = auVar96._0_2_;
    cVar58 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0] - (0xff < sVar11);
    sVar11 = auVar96._2_2_;
    auVar83._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar96[2] - (0xff < sVar11),
                  CONCAT18(cVar58,uVar82));
    sVar11 = auVar96._4_2_;
    cVar57 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[4] - (0xff < sVar11);
    auVar83[10] = cVar57;
    sVar11 = auVar96._6_2_;
    auVar83[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[6] - (0xff < sVar11);
    sVar11 = auVar96._8_2_;
    cVar56 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[8] - (0xff < sVar11);
    auVar86[0xc] = cVar56;
    auVar86._0_12_ = auVar83;
    sVar11 = auVar96._10_2_;
    auVar86[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[10] - (0xff < sVar11);
    sVar11 = auVar96._12_2_;
    cVar55 = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0xc] - (0xff < sVar11);
    auVar97[0xe] = cVar55;
    auVar97._0_14_ = auVar86;
    sVar11 = auVar96._14_2_;
    auVar97[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[0xe] - (0xff < sVar11);
    cVar3 = (0 < sVar69) * (sVar69 < 0x100) * cVar52 - (0xff < sVar69);
    sVar11 = (short)((uint)uVar71 >> 0x10);
    sVar70 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar44 - (0xff < sVar11),cVar3);
    sVar11 = (short)((uint6)uVar72 >> 0x20);
    cVar52 = (0 < sVar11) * (sVar11 < 0x100) * cVar46 - (0xff < sVar11);
    sVar11 = (short)((ulong)uVar39 >> 0x30);
    uVar71 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar47 - (0xff < sVar11),
                      CONCAT12(cVar52,sVar70));
    sVar11 = (short)((unkuint10)auVar73._0_10_ >> 0x40);
    cVar44 = (0 < sVar11) * (sVar11 < 0x100) * cVar48 - (0xff < sVar11);
    sVar11 = auVar73._10_2_;
    uVar72 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar49 - (0xff < sVar11),
                      CONCAT14(cVar44,uVar71));
    sVar11 = auVar75._12_2_;
    cVar50 = (0 < sVar11) * (sVar11 < 0x100) * cVar50 - (0xff < sVar11);
    sVar11 = auVar77._14_2_;
    uVar39 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * cVar51 - (0xff < sVar11),
                      CONCAT16(cVar50,uVar72));
    cVar49 = (0 < sVar78) * (sVar78 < 0x100) * cVar61 - (0xff < sVar78);
    sVar11 = (short)((uint)uVar80 >> 0x10);
    auVar74._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * cVar60 - (0xff < sVar11),CONCAT18(cVar49,uVar39)
                 );
    sVar11 = (short)((uint6)uVar81 >> 0x20);
    cVar48 = (0 < sVar11) * (sVar11 < 0x100) * cVar53 - (0xff < sVar11);
    auVar74[10] = cVar48;
    sVar11 = (short)((ulong)uVar82 >> 0x30);
    auVar74[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar59 - (0xff < sVar11);
    sVar11 = (short)((unkuint10)auVar83._0_10_ >> 0x40);
    cVar47 = (0 < sVar11) * (sVar11 < 0x100) * cVar58 - (0xff < sVar11);
    auVar76[0xc] = cVar47;
    auVar76._0_12_ = auVar74;
    sVar11 = auVar83._10_2_;
    auVar76[0xd] = (0 < sVar11) * (sVar11 < 0x100) * cVar57 - (0xff < sVar11);
    sVar11 = auVar86._12_2_;
    cVar46 = (0 < sVar11) * (sVar11 < 0x100) * cVar56 - (0xff < sVar11);
    auVar89[0xe] = cVar46;
    auVar89._0_14_ = auVar76;
    sVar11 = auVar97._14_2_;
    auVar89[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar55 - (0xff < sVar11);
    auVar77 = auVar64 & _DAT_00105090;
    auVar97 = auVar63 & _DAT_00105090;
    sVar11 = auVar77._0_2_;
    cVar51 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[0] - (0xff < sVar11);
    sVar11 = auVar77._2_2_;
    sVar69 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar77[2] - (0xff < sVar11),cVar51);
    sVar11 = auVar77._4_2_;
    cVar53 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[4] - (0xff < sVar11);
    sVar11 = auVar77._6_2_;
    uVar80 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar77[6] - (0xff < sVar11),
                      CONCAT12(cVar53,sVar69));
    sVar11 = auVar77._8_2_;
    cVar55 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[8] - (0xff < sVar11);
    sVar11 = auVar77._10_2_;
    uVar81 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar77[10] - (0xff < sVar11),
                      CONCAT14(cVar55,uVar80));
    sVar11 = auVar77._12_2_;
    cVar56 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[0xc] - (0xff < sVar11);
    sVar11 = auVar77._14_2_;
    uVar82 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar77[0xe] - (0xff < sVar11),
                      CONCAT16(cVar56,uVar81));
    sVar11 = auVar97._0_2_;
    cVar57 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[0] - (0xff < sVar11);
    sVar11 = auVar97._2_2_;
    auVar84._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar97[2] - (0xff < sVar11),
                  CONCAT18(cVar57,uVar82));
    sVar11 = auVar97._4_2_;
    cVar58 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[4] - (0xff < sVar11);
    auVar84[10] = cVar58;
    sVar11 = auVar97._6_2_;
    auVar84[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar97[6] - (0xff < sVar11);
    sVar11 = auVar97._8_2_;
    cVar59 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[8] - (0xff < sVar11);
    auVar87[0xc] = cVar59;
    auVar87._0_12_ = auVar84;
    sVar11 = auVar97._10_2_;
    auVar87[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar97[10] - (0xff < sVar11);
    sVar11 = auVar97._12_2_;
    cVar60 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[0xc] - (0xff < sVar11);
    auVar96[0xe] = cVar60;
    auVar96._0_14_ = auVar87;
    sVar11 = auVar97._14_2_;
    auVar96[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar97[0xe] - (0xff < sVar11);
    auVar77 = auVar62 & _DAT_00105090;
    auVar97 = auVar45 & _DAT_00105090;
    sVar11 = auVar77._0_2_;
    cVar61 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[0] - (0xff < sVar11);
    sVar11 = auVar77._2_2_;
    sVar78 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar77[2] - (0xff < sVar11),cVar61);
    sVar11 = auVar77._4_2_;
    cVar4 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[4] - (0xff < sVar11);
    sVar11 = auVar77._6_2_;
    uVar91 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar77[6] - (0xff < sVar11),
                      CONCAT12(cVar4,sVar78));
    sVar11 = auVar77._8_2_;
    cVar5 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[8] - (0xff < sVar11);
    sVar11 = auVar77._10_2_;
    uVar92 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar77[10] - (0xff < sVar11),
                      CONCAT14(cVar5,uVar91));
    sVar11 = auVar77._12_2_;
    cVar6 = (0 < sVar11) * (sVar11 < 0x100) * auVar77[0xc] - (0xff < sVar11);
    sVar11 = auVar77._14_2_;
    uVar93 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar77[0xe] - (0xff < sVar11),
                      CONCAT16(cVar6,uVar92));
    sVar11 = auVar97._0_2_;
    cVar7 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[0] - (0xff < sVar11);
    sVar11 = auVar97._2_2_;
    auVar94._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar97[2] - (0xff < sVar11),
                  CONCAT18(cVar7,uVar93));
    sVar11 = auVar97._4_2_;
    cVar8 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[4] - (0xff < sVar11);
    auVar94[10] = cVar8;
    sVar11 = auVar97._6_2_;
    auVar94[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar97[6] - (0xff < sVar11);
    sVar11 = auVar97._8_2_;
    cVar9 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[8] - (0xff < sVar11);
    auVar95[0xc] = cVar9;
    auVar95._0_12_ = auVar94;
    sVar11 = auVar97._10_2_;
    auVar95[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar97[10] - (0xff < sVar11);
    sVar11 = auVar97._12_2_;
    cVar10 = (0 < sVar11) * (sVar11 < 0x100) * auVar97[0xc] - (0xff < sVar11);
    auVar98[0xe] = cVar10;
    auVar98._0_14_ = auVar95;
    sVar11 = auVar97._14_2_;
    auVar98[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar97[0xe] - (0xff < sVar11);
    cVar51 = (0 < sVar69) * (sVar69 < 0x100) * cVar51 - (0xff < sVar69);
    sVar11 = (short)((uint)uVar80 >> 0x10);
    sVar79 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar53 - (0xff < sVar11),cVar51);
    sVar11 = (short)((uint6)uVar81 >> 0x20);
    cVar53 = (0 < sVar11) * (sVar11 < 0x100) * cVar55 - (0xff < sVar11);
    sVar11 = (short)((ulong)uVar82 >> 0x30);
    uVar80 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar56 - (0xff < sVar11),
                      CONCAT12(cVar53,sVar79));
    sVar11 = (short)((unkuint10)auVar84._0_10_ >> 0x40);
    cVar55 = (0 < sVar11) * (sVar11 < 0x100) * cVar57 - (0xff < sVar11);
    sVar11 = auVar84._10_2_;
    uVar81 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar58 - (0xff < sVar11),
                      CONCAT14(cVar55,uVar80));
    sVar11 = auVar87._12_2_;
    cVar56 = (0 < sVar11) * (sVar11 < 0x100) * cVar59 - (0xff < sVar11);
    sVar11 = auVar96._14_2_;
    uVar82 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * cVar60 - (0xff < sVar11),
                      CONCAT16(cVar56,uVar81));
    cVar57 = (0 < sVar78) * (sVar78 < 0x100) * cVar61 - (0xff < sVar78);
    sVar11 = (short)((uint)uVar91 >> 0x10);
    auVar85._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11),CONCAT18(cVar57,uVar82))
    ;
    sVar11 = (short)((uint6)uVar92 >> 0x20);
    cVar58 = (0 < sVar11) * (sVar11 < 0x100) * cVar5 - (0xff < sVar11);
    auVar85[10] = cVar58;
    sVar11 = (short)((ulong)uVar93 >> 0x30);
    auVar85[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
    sVar11 = (short)((unkuint10)auVar94._0_10_ >> 0x40);
    cVar59 = (0 < sVar11) * (sVar11 < 0x100) * cVar7 - (0xff < sVar11);
    auVar88[0xc] = cVar59;
    auVar88._0_12_ = auVar85;
    sVar11 = auVar94._10_2_;
    auVar88[0xd] = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
    sVar11 = auVar95._12_2_;
    cVar60 = (0 < sVar11) * (sVar11 < 0x100) * cVar9 - (0xff < sVar11);
    auVar90[0xe] = cVar60;
    auVar90._0_14_ = auVar88;
    sVar11 = auVar98._14_2_;
    auVar90[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar10 - (0xff < sVar11);
    sVar11 = (short)((uint)uVar71 >> 0x10);
    sVar69 = (short)((uint6)uVar72 >> 0x20);
    sVar78 = (short)((ulong)uVar39 >> 0x30);
    sVar12 = (short)((unkuint10)auVar74._0_10_ >> 0x40);
    sVar13 = auVar74._10_2_;
    sVar14 = auVar76._12_2_;
    sVar15 = auVar89._14_2_;
    sVar16 = (short)((uint)uVar80 >> 0x10);
    sVar17 = (short)((uint6)uVar81 >> 0x20);
    sVar18 = (short)((ulong)uVar82 >> 0x30);
    sVar19 = (short)((unkuint10)auVar85._0_10_ >> 0x40);
    sVar20 = auVar85._10_2_;
    sVar21 = auVar88._12_2_;
    sVar22 = auVar90._14_2_;
    acStack_300[lVar36 + -8] = ((0 < sVar70) * (sVar70 < 0x100) * cVar3 - (0xff < sVar70)) + '\x01';
    acStack_300[lVar36 + -7] = ((0 < sVar11) * (sVar11 < 0x100) * cVar52 - (0xff < sVar11)) + '\x01'
    ;
    acStack_300[lVar36 + -6] = ((0 < sVar69) * (sVar69 < 0x100) * cVar44 - (0xff < sVar69)) + '\x01'
    ;
    acStack_300[lVar36 + -5] = ((0 < sVar78) * (sVar78 < 0x100) * cVar50 - (0xff < sVar78)) + '\x01'
    ;
    acStack_300[lVar36 + -4] = ((0 < sVar12) * (sVar12 < 0x100) * cVar49 - (0xff < sVar12)) + '\x01'
    ;
    acStack_300[lVar36 + -3] = ((0 < sVar13) * (sVar13 < 0x100) * cVar48 - (0xff < sVar13)) + '\x01'
    ;
    acStack_300[lVar36 + -2] = ((0 < sVar14) * (sVar14 < 0x100) * cVar47 - (0xff < sVar14)) + '\x01'
    ;
    acStack_300[lVar36 + -1] = ((0 < sVar15) * (sVar15 < 0x100) * cVar46 - (0xff < sVar15)) + '\x01'
    ;
    acStack_300[lVar36] = ((0 < sVar79) * (sVar79 < 0x100) * cVar51 - (0xff < sVar79)) + '\x01';
    acStack_300[lVar36 + 1] = ((0 < sVar16) * (sVar16 < 0x100) * cVar53 - (0xff < sVar16)) + '\x01';
    acStack_300[lVar36 + 2] = ((0 < sVar17) * (sVar17 < 0x100) * cVar55 - (0xff < sVar17)) + '\x01';
    acStack_300[lVar36 + 3] = ((0 < sVar18) * (sVar18 < 0x100) * cVar56 - (0xff < sVar18)) + '\x01';
    acStack_300[lVar36 + 4] = ((0 < sVar19) * (sVar19 < 0x100) * cVar57 - (0xff < sVar19)) + '\x01';
    acStack_300[lVar36 + 5] = ((0 < sVar20) * (sVar20 < 0x100) * cVar58 - (0xff < sVar20)) + '\x01';
    acStack_300[lVar36 + 6] = ((0 < sVar21) * (sVar21 < 0x100) * cVar59 - (0xff < sVar21)) + '\x01';
    acStack_300[lVar36 + 7] = ((0 < sVar22) * (sVar22 < 0x100) * cVar60 - (0xff < sVar22)) + '\x01';
    lVar54 = auVar68._8_8_;
    auVar68._0_8_ = auVar68._0_8_ + 0x10;
    auVar68._8_8_ = lVar54 + 0x10;
    lVar54 = auVar67._8_8_;
    auVar67._0_8_ = auVar67._0_8_ + 0x10;
    auVar67._8_8_ = lVar54 + 0x10;
    lVar54 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 0x10;
    auVar66._8_8_ = lVar54 + 0x10;
    lVar54 = auVar65._8_8_;
    auVar65._0_8_ = auVar65._0_8_ + 0x10;
    auVar65._8_8_ = lVar54 + 0x10;
    lVar54 = auVar64._8_8_;
    auVar64._0_8_ = auVar64._0_8_ + 0x10;
    auVar64._8_8_ = lVar54 + 0x10;
    lVar54 = auVar63._8_8_;
    auVar63._0_8_ = auVar63._0_8_ + 0x10;
    auVar63._8_8_ = lVar54 + 0x10;
    lVar54 = auVar62._8_8_;
    auVar62._0_8_ = auVar62._0_8_ + 0x10;
    auVar62._8_8_ = lVar54 + 0x10;
    lVar54 = auVar45._8_8_;
    auVar45._0_8_ = auVar45._0_8_ + 0x10;
    auVar45._8_8_ = lVar54 + 0x10;
    lVar36 = lVar36 + 0x10;
  } while (lVar36 != 0x28);
  cVar44 = '\0';
  cVar46 = '\x01';
  cVar47 = '\x02';
  cVar48 = '\x03';
  cVar49 = '\x04';
  cVar50 = '\x05';
  cVar51 = '\x06';
  cVar52 = '\a';
  cVar53 = '\b';
  cVar55 = '\t';
  cVar56 = '\n';
  cVar57 = '\v';
  cVar58 = '\f';
  cVar59 = '\r';
  cVar60 = '\x0e';
  cVar61 = '\x0f';
  lVar36 = 0x28;
  do {
    acStack_300[lVar36 + -8] = cVar44 + DAT_001050c0;
    acStack_300[lVar36 + -7] = cVar46 + DAT_001050c0._1_1_;
    acStack_300[lVar36 + -6] = cVar47 + DAT_001050c0._2_1_;
    acStack_300[lVar36 + -5] = cVar48 + DAT_001050c0._3_1_;
    acStack_300[lVar36 + -4] = cVar49 + DAT_001050c0._4_1_;
    acStack_300[lVar36 + -3] = cVar50 + DAT_001050c0._5_1_;
    acStack_300[lVar36 + -2] = cVar51 + DAT_001050c0._6_1_;
    acStack_300[lVar36 + -1] = cVar52 + DAT_001050c0._7_1_;
    acStack_300[lVar36] = cVar53 + DAT_001050c0._8_1_;
    acStack_300[lVar36 + 1] = cVar55 + DAT_001050c0._9_1_;
    acStack_300[lVar36 + 2] = cVar56 + DAT_001050c0._10_1_;
    acStack_300[lVar36 + 3] = cVar57 + DAT_001050c0._11_1_;
    acStack_300[lVar36 + 4] = cVar58 + DAT_001050c0._12_1_;
    acStack_300[lVar36 + 5] = cVar59 + DAT_001050c0._13_1_;
    acStack_300[lVar36 + 6] = cVar60 + DAT_001050c0._14_1_;
    acStack_300[lVar36 + 7] = cVar61 + DAT_001050c0._15_1_;
    cVar44 = cVar44 + DAT_001050d0;
    cVar46 = cVar46 + DAT_001050d0._1_1_;
    cVar47 = cVar47 + DAT_001050d0._2_1_;
    cVar48 = cVar48 + DAT_001050d0._3_1_;
    cVar49 = cVar49 + DAT_001050d0._4_1_;
    cVar50 = cVar50 + DAT_001050d0._5_1_;
    cVar51 = cVar51 + DAT_001050d0._6_1_;
    cVar52 = cVar52 + DAT_001050d0._7_1_;
    cVar53 = cVar53 + DAT_001050d0._8_1_;
    cVar55 = cVar55 + DAT_001050d0._9_1_;
    cVar56 = cVar56 + DAT_001050d0._10_1_;
    cVar57 = cVar57 + DAT_001050d0._11_1_;
    cVar58 = cVar58 + DAT_001050d0._12_1_;
    cVar59 = cVar59 + DAT_001050d0._13_1_;
    cVar60 = cVar60 + DAT_001050d0._14_1_;
    cVar61 = cVar61 + DAT_001050d0._15_1_;
    lVar36 = lVar36 + 0x10;
  } while (lVar36 != 0x48);
  uStack_278 = 0x48;
  uVar39 = 0;
  iVar24 = secp256k1_ecdsa_sign(uStack_308,auStack_1d8,acStack_300,auStack_2e0,0);
  if (iVar24 == 0) {
LAB_00103a6c:
    main_cold_10();
LAB_00103a71:
    main_cold_9();
  }
  else {
    iVar24 = secp256k1_ecdsa_signature_serialize_der(uStack_308,auStack_2c0,&uStack_278,auStack_1d8)
    ;
    if (iVar24 == 0) goto LAB_00103a71;
    iVar24 = secp256k1_ec_pubkey_create(uStack_308,auStack_198,auStack_2e0);
    if (iVar24 != 0) {
      uStack_248 = 0x21;
      iVar24 = secp256k1_ec_pubkey_serialize(uStack_308,auStack_270,&uStack_248,auStack_198,0x102);
      if (iVar24 != 1) goto LAB_00103a7b;
      printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
             "    Max(us)    ");
      putchar(10);
      iVar24 = (int)uVar28;
      if (argc == 1) {
LAB_001034c3:
        run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr_int *)&uStack_308,(void *)(uVar28 & 0xffffffff),
                      (int)uVar39,in_stack_fffffffffffffc70);
      }
      else {
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_00103469;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"ecdsa");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_001034c3;
LAB_00103469:
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_00103496;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"verify");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_001034c3;
LAB_00103496:
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_001034e3;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"ecdsa_verify");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_001034c3;
      }
LAB_001034e3:
      if (argc == 1) {
LAB_00103573:
        run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,
                      (_func_void_void_ptr_int *)&uStack_308,(void *)(uVar28 & 0xffffffff),
                      (int)uVar39,in_stack_fffffffffffffc70);
      }
      else {
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_00103519;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"ecdsa");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_00103573;
LAB_00103519:
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_00103546;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"sign");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_00103573;
LAB_00103546:
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_00103598;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"ecdsa_sign");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_00103573;
      }
LAB_00103598:
      if (argc == 1) {
LAB_00103628:
        run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                      (_func_void_void_ptr_int *)&uStack_308,(void *)(uVar28 & 0xffffffff),
                      (int)uVar39,in_stack_fffffffffffffc70);
      }
      else {
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_001035ce;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"ec");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_00103628;
LAB_001035ce:
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_001035fb;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"keygen");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_00103628;
LAB_001035fb:
        lVar36 = 8;
        do {
          lVar54 = lVar36;
          if (lVar35 - lVar54 == 0) goto LAB_0010364d;
          iVar25 = strcmp(*(char **)((long)argv + lVar54),"ec_keygen");
          lVar36 = lVar54 + 8;
        } while (iVar25 != 0);
        if (lVar35 - lVar54 != 0) goto LAB_00103628;
      }
LAB_0010364d:
      secp256k1_context_destroy(uStack_308);
      auStack_240[0] = secp256k1_context_create(1);
      if (argc != 1) {
        lVar36 = 8;
        do {
          if (lVar35 - lVar36 == 0) goto LAB_001036bc;
          iVar25 = strcmp(*(char **)((long)argv + lVar36),"ecdh");
          lVar36 = lVar36 + 8;
        } while (iVar25 != 0);
      }
      run_benchmark("ecdh",bench_ecdh,bench_ecdh_setup,(_func_void_void_ptr_int *)auStack_240,
                    (void *)(uVar28 & 0xffffffff),(int)uVar39,in_stack_fffffffffffffc70);
LAB_001036bc:
      lStack_338 = lVar35;
      secp256k1_context_destroy(auStack_240[0]);
      auStack_368[0] = secp256k1_context_create(1);
      __size = (long)iVar24 << 3;
      pvStack_358 = malloc(__size);
      pvStack_350 = malloc(__size);
      pvStack_340 = malloc(__size);
      pvStack_348 = malloc(__size);
      if (0 < iVar24) {
        uVar40 = 0;
        do {
          puVar29 = (undefined1 *)malloc(0x20);
          pvVar30 = malloc(0x40);
          pvVar31 = malloc(0x60);
          pvVar32 = malloc(0x20);
          uStack_330 = (undefined1)uVar40;
          *puVar29 = uStack_330;
          uStack_32f = (undefined1)(uVar40 >> 8);
          puVar29[1] = uStack_32f;
          uStack_32e = (undefined1)(uVar40 >> 0x10);
          puVar29[2] = uStack_32e;
          uStack_32d = (undefined1)(uVar40 >> 0x18);
          puVar29[3] = uStack_32d;
          *(undefined8 *)(puVar29 + 4) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar29 + 0xc) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar29 + 0x10) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar29 + 0x18) = 0x6d6d6d6d6d6d6d6d;
          uStack_31c = 0x73737373;
          uStack_318 = 0x7373737373737373;
          uStack_32c = 0x7373737373737373;
          uStack_324 = 0x73737373;
          uStack_320 = 0x73737373;
          *(void **)((long)pvStack_358 + uVar40 * 8) = pvVar31;
          *(void **)((long)pvStack_350 + uVar40 * 8) = pvVar32;
          *(undefined1 **)((long)pvStack_340 + uVar40 * 8) = puVar29;
          *(void **)((long)pvStack_348 + uVar40 * 8) = pvVar30;
          iVar25 = secp256k1_keypair_create(auStack_368[0],pvVar31,&uStack_330);
          if (iVar25 == 0) {
            main_cold_7();
LAB_00103a5d:
            main_cold_6();
LAB_00103a62:
            main_cold_5();
LAB_00103a67:
            main_cold_4();
            goto LAB_00103a6c;
          }
          uVar39 = 0;
          iVar25 = secp256k1_schnorrsig_sign_custom(auStack_368[0],pvVar30,puVar29,0x20,pvVar31);
          if (iVar25 == 0) goto LAB_00103a5d;
          iVar25 = secp256k1_keypair_xonly_pub(auStack_368[0],auStack_240,0,pvVar31);
          if (iVar25 == 0) goto LAB_00103a62;
          iVar25 = secp256k1_xonly_pubkey_serialize(auStack_368[0],pvVar32,auStack_240);
          if (iVar25 != 1) goto LAB_00103a67;
          uVar40 = uVar40 + 1;
        } while ((uVar28 & 0xffffffff) != uVar40);
      }
      lVar35 = lStack_338;
      if (argc != 1) {
        lVar36 = 8;
        do {
          if (lVar35 == lVar36) {
            lVar36 = 8;
            goto LAB_001038b0;
          }
          iVar25 = strcmp(*(char **)((long)argv + lVar36),"schnorrsig");
          lVar36 = lVar36 + 8;
        } while (iVar25 != 0);
      }
      goto LAB_001038f1;
    }
  }
  main_cold_8();
LAB_00103a7b:
  main_cold_3();
  puts("Benchmarks the following algorithms:");
  puts("    - ECDSA signing/verification");
  puts("    - ECDH key exchange (optional module)");
  puts("    - Schnorr signatures (optional module)");
  puts("    - ElligatorSwift (optional module)");
  putchar(10);
  printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
  puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
  putchar(10);
  puts("Usage: ./bench [args]");
  puts("By default, all benchmarks will be run.");
  puts("args:");
  puts("    help              : display this help and exit");
  puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
  puts("    ecdsa_sign        : ECDSA siging algorithm");
  puts("    ecdsa_verify      : ECDSA verification algorithm");
  puts("    ec                : all EC public key algorithms (keygen)");
  puts("    ec_keygen         : EC public key generation");
  puts("    ecdh              : ECDH key exchange algorithm");
  puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
  puts("    schnorrsig_sign   : Schnorr sigining algorithm");
  puts("    schnorrsig_verify : Schnorr verification algorithm");
  puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
  puts("    ellswift_encode   : ElligatorSwift encoding");
  puts("    ellswift_decode   : ElligatorSwift decoding");
  puts("    ellswift_keygen   : ElligatorSwift key generation");
  puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
  putchar(10);
  return;
  while( true ) {
    iVar25 = strcmp(*(char **)((long)argv + lVar36),"sign");
    lVar36 = lVar36 + 8;
    if (iVar25 == 0) break;
LAB_001038b0:
    if (lVar35 == lVar36) {
      lVar36 = 8;
      goto LAB_001038d8;
    }
  }
  goto LAB_001038f1;
  while( true ) {
    iVar26 = strcmp(*(char **)((long)argv + lVar36),"verify");
    iVar25 = (int)uVar39;
    lVar36 = lVar36 + 8;
    if (iVar26 == 0) break;
LAB_00103948:
    if (lVar35 == lVar36) {
      lVar36 = 8;
      goto LAB_00103970;
    }
  }
  goto LAB_00103989;
  while( true ) {
    iVar26 = strcmp(*(char **)((long)argv + lVar36),"schnorrsig_verify");
    iVar25 = (int)uVar39;
    lVar36 = lVar36 + 8;
    if (iVar26 == 0) break;
LAB_00103970:
    if (lVar35 == lVar36) goto LAB_001039a6;
  }
  goto LAB_00103989;
  while( true ) {
    iVar25 = strcmp(*(char **)((long)argv + lVar36),"schnorrsig_sign");
    lVar36 = lVar36 + 8;
    if (iVar25 == 0) break;
LAB_001038d8:
    if (lVar35 == lVar36) goto LAB_0010390e;
  }
LAB_001038f1:
  run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_368,(void *)(uVar28 & 0xffffffff),(int)uVar39,
                in_stack_fffffffffffffc70);
LAB_0010390e:
  iVar25 = (int)uVar39;
  if (argc != 1) {
    lVar36 = 8;
    do {
      if (lVar35 == lVar36) {
        lVar36 = 8;
        goto LAB_00103948;
      }
      iVar26 = strcmp(*(char **)((long)argv + lVar36),"schnorrsig");
      iVar25 = (int)uVar39;
      lVar36 = lVar36 + 8;
    } while (iVar26 != 0);
  }
LAB_00103989:
  run_benchmark("schnorrsig_verify",bench_schnorrsig_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_368,(void *)(uVar28 & 0xffffffff),iVar25,
                in_stack_fffffffffffffc70);
LAB_001039a6:
  if (0 < iVar24) {
    uVar40 = 0;
    do {
      free(*(void **)((long)pvStack_358 + uVar40 * 8));
      free(*(void **)((long)pvStack_350 + uVar40 * 8));
      free(*(void **)((long)pvStack_340 + uVar40 * 8));
      free(*(void **)((long)pvStack_348 + uVar40 * 8));
      uVar40 = uVar40 + 1;
    } while ((uVar28 & 0xffffffff) != uVar40);
  }
  free(pvStack_358);
  free(pvStack_350);
  free(pvStack_340);
  free(pvStack_348);
  secp256k1_context_destroy(auStack_368[0]);
  run_ellswift_bench(iVar24,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_decode(void *arg, int iters) {
    int i;
    secp256k1_pubkey out;
    size_t len;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        CHECK(secp256k1_ellswift_decode(data->ctx, &out, data->rnd64) == 1);
        len = 33;
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, data->rnd64 + (i % 32), &len, &out, SECP256K1_EC_COMPRESSED));
    }
}